

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

void __thiscall CLayer::CreateBoundary(CLayer *this)

{
  int iVar1;
  CBoundary *this_00;
  uint uVar2;
  int iVar3;
  int i;
  int iX;
  int j;
  
  iVar1 = IsHorizontal(this);
  if (iVar1 == 0) {
    iVar1 = IsVertical(this);
    if (iVar1 == 0) {
      __assert_fail("IsHorizontal()||IsVertical()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                    ,0xb1,"void CLayer::CreateBoundary()");
    }
  }
  iVar1 = IsHorizontal(this);
  uVar2 = (uint)(CObject::m_pDesign->super_CBBox).m_iMinX;
  if (iVar1 == 0) {
    uVar2 = -uVar2;
    iVar1 = ~(int)(CObject::m_pDesign->super_CBBox).m_iMinY +
            (int)(CObject::m_pDesign->super_CBBox).m_iMaxY;
  }
  else {
    uVar2 = ~uVar2;
    iVar1 = (int)(CObject::m_pDesign->super_CBBox).m_iMaxY -
            (int)(CObject::m_pDesign->super_CBBox).m_iMinY;
  }
  iVar3 = uVar2 + (int)(CObject::m_pDesign->super_CBBox).m_iMaxX;
  this->m_iMaxBX = iVar3;
  this->m_iMaxBY = iVar1;
  for (iX = 0; iX < iVar3; iX = iX + 1) {
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      this_00 = GetBoundary(this,iX,iVar3);
      CBoundary::Initialize(this_00,iX,iVar3,(int)(this->super_CObject).m_Key,this);
      iVar1 = this->m_iMaxBY;
    }
    iVar3 = this->m_iMaxBX;
  }
  return;
}

Assistant:

void CLayer::CreateBoundary()
{ 
	assert(IsHorizontal()||IsVertical());

	// different size of boundary array by direction [6/22/2006 thyeros]
	if(IsHorizontal())	
	{
		m_iMaxBX	=	GetDesign()->W()-1;
		m_iMaxBY	=	GetDesign()->H();
	}
	else		
	{
		m_iMaxBX	=	GetDesign()->W();
		m_iMaxBY	=	GetDesign()->H()-1;
	}

	for (int i=0;i<m_iMaxBX;++i)
		for (int j=0;j<m_iMaxBY;++j)
			GetBoundary(i,j)->CBoundary::Initialize(i,j,GetKey(),this);
}